

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatetimeParser.cpp
# Opt level: O0

bool __thiscall DatetimeParser::parse_date_ext(DatetimeParser *this,Pig *pig)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int local_4c;
  int local_48;
  int weekday;
  int week;
  int julian;
  int day;
  int month;
  size_type checkpointYear;
  size_type sStack_28;
  int year;
  size_type checkpoint;
  Pig *pig_local;
  DatetimeParser *this_local;
  
  checkpoint = (size_type)pig;
  pig_local = (Pig *)this;
  sStack_28 = Pig::cursor(pig);
  checkpointYear._4_4_ = 0;
  bVar1 = parse_year(this,(Pig *)checkpoint,(int *)((long)&checkpointYear + 4));
  if ((bVar1) && (bVar1 = Pig::skip((Pig *)checkpoint,0x2d), bVar1)) {
    _day = Pig::cursor((Pig *)checkpoint);
    julian = 0;
    week = 0;
    weekday = 0;
    local_48 = 0;
    local_4c = 0;
    bVar1 = Pig::skip((Pig *)checkpoint,0x57);
    if ((bVar1) && (bVar1 = parse_week(this,(Pig *)checkpoint,&local_48), bVar1)) {
      bVar1 = Pig::skip((Pig *)checkpoint,0x2d);
      if ((!bVar1) || (bVar1 = parse_weekday(this,(Pig *)checkpoint,&local_4c), !bVar1)) {
        local_4c = Datetime::weekstart;
      }
      uVar3 = Pig::peek((Pig *)checkpoint);
      bVar1 = unicodeLatinDigit(uVar3);
      if (!bVar1) {
        this->_weekday = local_4c;
        this->_week = local_48;
        this->_year = checkpointYear._4_4_;
        return true;
      }
    }
    Pig::restoreTo((Pig *)checkpoint,_day);
    bVar1 = parse_month(this,(Pig *)checkpoint,&julian);
    if (((bVar1) && (bVar1 = Pig::skip((Pig *)checkpoint,0x2d), bVar1)) &&
       (bVar1 = parse_day(this,(Pig *)checkpoint,&week), bVar1)) {
      uVar3 = Pig::peek((Pig *)checkpoint);
      bVar1 = unicodeLatinDigit(uVar3);
      if (!bVar1) {
        this->_year = checkpointYear._4_4_;
        this->_month = julian;
        this->_day = week;
        return true;
      }
    }
    Pig::restoreTo((Pig *)checkpoint,_day);
    bVar1 = parse_julian(this,(Pig *)checkpoint,&weekday);
    if (bVar1) {
      uVar3 = Pig::peek((Pig *)checkpoint);
      bVar1 = unicodeLatinDigit(uVar3);
      if (!bVar1) {
        this->_year = checkpointYear._4_4_;
        this->_julian = weekday;
        return true;
      }
    }
    Pig::restoreTo((Pig *)checkpoint,_day);
    bVar1 = parse_month(this,(Pig *)checkpoint,&julian);
    if ((bVar1) && (iVar2 = Pig::peek((Pig *)checkpoint), iVar2 != 0x2d)) {
      uVar3 = Pig::peek((Pig *)checkpoint);
      bVar1 = unicodeLatinDigit(uVar3);
      if (!bVar1) {
        this->_year = checkpointYear._4_4_;
        this->_month = julian;
        this->_day = 1;
        return true;
      }
    }
  }
  Pig::restoreTo((Pig *)checkpoint,sStack_28);
  return false;
}

Assistant:

bool DatetimeParser::parse_date_ext (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  int year {};
  if (parse_year (pig, year) &&
      pig.skip ('-'))
  {
    auto checkpointYear = pig.cursor ();

    int month {};
    int day {};
    int julian {};
    int week {};
    int weekday {};

    if (pig.skip ('W') &&
        parse_week (pig, week))
    {
      if (! (pig.skip ('-') &&
             parse_weekday (pig, weekday)))
      {
        weekday = Datetime::weekstart;
      }

      if (! unicodeLatinDigit (pig.peek ()))
      {
        _weekday = weekday;
        _week = week;
        _year = year;
        return true;
      }
    }

    pig.restoreTo (checkpointYear);

    if (parse_month (pig, month) &&
        pig.skip ('-')           &&
        parse_day (pig, day)     &&
        ! unicodeLatinDigit (pig.peek ()))
    {
      _year = year;
      _month = month;
      _day = day;
      return true;
    }

    pig.restoreTo (checkpointYear);

    if (parse_julian (pig, julian) &&
        ! unicodeLatinDigit (pig.peek ()))
    {
      _year = year;
      _julian = julian;
      return true;
    }

    pig.restoreTo (checkpointYear);

    if (parse_month (pig, month) &&
        pig.peek () != '-'       &&
        ! unicodeLatinDigit (pig.peek ()))
    {
      _year = year;
      _month = month;
      _day = 1;
      return true;
    }
  }

  pig.restoreTo (checkpoint);
  return false;
}